

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

return_type __thiscall
flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::
LookupByKey<unsigned_char>
          (Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *this,uchar key)

{
  uint uVar1;
  uint8_t *puVar2;
  uint8_t *element;
  void *search_result;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *pVStack_18;
  uchar key_local;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *this_local;
  
  search_result._7_1_ = key;
  pVStack_18 = this;
  puVar2 = Data(this);
  uVar1 = size(this);
  puVar2 = (uint8_t *)
           bsearch((void *)((long)&search_result + 7),puVar2,(ulong)uVar1,4,
                   KeyCompare<unsigned_char>);
  if (puVar2 == (uint8_t *)0x0) {
    this_local = (Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *)0x0;
  }
  else {
    this_local = (Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *)
                 IndirectHelper<flatbuffers::Offset<reflection::EnumVal>_>::Read(puVar2,0);
  }
  return (return_type)this_local;
}

Assistant:

return_type LookupByKey(K key) const {
    void *search_result = std::bsearch(
        &key, Data(), size(), IndirectHelper<T>::element_stride, KeyCompare<K>);

    if (!search_result) {
      return nullptr;  // Key not found.
    }

    const uint8_t *element = reinterpret_cast<const uint8_t *>(search_result);

    return IndirectHelper<T>::Read(element, 0);
  }